

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformparser.cpp
# Opt level: O0

mat4f * parseTransform(Json *conf)

{
  float fVar1;
  float fVar2;
  float k20;
  float k21;
  float k22;
  float k30;
  float k31;
  float k32;
  undefined8 uVar3;
  value_t vVar4;
  bool bVar5;
  size_type sVar6;
  undefined8 *puVar7;
  reference pvVar8;
  float *pfVar9;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_RSI;
  mat4f *in_RDI;
  vec3f vVar10;
  vec3f offset;
  vec3f scale;
  vector<float,_std::allocator<float>_> v;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffd90;
  float k23;
  undefined4 in_stack_fffffffffffffd94;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  undefined4 in_stack_fffffffffffffdc0;
  float in_stack_fffffffffffffdc4;
  undefined4 in_stack_fffffffffffffdf8;
  value_type k00;
  undefined4 in_stack_fffffffffffffdfc;
  value_type k01;
  undefined4 in_stack_fffffffffffffe00;
  value_type k02;
  undefined4 in_stack_fffffffffffffe04;
  value_type k03;
  undefined4 in_stack_fffffffffffffe10;
  value_type k12;
  undefined4 in_stack_fffffffffffffe14;
  value_type k13;
  float local_1c8;
  float local_1bc;
  float fStack_1b8;
  undefined1 local_110 [128];
  vec3f local_90;
  undefined8 local_7c;
  float local_74;
  vector<float,_std::allocator<float>_> local_20;
  
  vVar4 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::type(in_RSI);
  if (vVar4 == array) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator_vector<std::vector<float,_std::allocator<float>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    sVar6 = std::vector<float,_std::allocator<float>_>::size(&local_20);
    if (sVar6 != 0x10) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar7 = "bad transformation matrix";
      __cxa_throw(puVar7,&char_const*::typeinfo,0);
    }
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&local_20,0);
    k00 = *pvVar8;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&local_20,1);
    k01 = *pvVar8;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&local_20,2);
    k02 = *pvVar8;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&local_20,3);
    k03 = *pvVar8;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&local_20,4);
    fVar1 = *pvVar8;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&local_20,5);
    fVar2 = *pvVar8;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&local_20,6);
    k12 = *pvVar8;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&local_20,7);
    k13 = *pvVar8;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&local_20,8);
    k20 = *pvVar8;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&local_20,9);
    k21 = *pvVar8;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&local_20,10);
    k22 = *pvVar8;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&local_20,0xb);
    k23 = *pvVar8;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&local_20,0xc);
    k30 = *pvVar8;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&local_20,0xd);
    k31 = *pvVar8;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&local_20,0xe);
    k32 = *pvVar8;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&local_20,0xf);
    mat4f::mat4f(in_RDI,k00,k01,k02,k03,fVar1,fVar2,k12,k13,k20,k21,k22,k23,k30,k31,k32,*pvVar8);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)CONCAT44(in_stack_fffffffffffffd94,k23));
  }
  else {
    memcpy(in_RDI,&mat4f::unit,0x40);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::find<char_const(&)[6]>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               (char (*) [6])CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    bVar5 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                         (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    if (bVar5) {
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      vVar10 = json2vec3f((Json *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
      local_90._0_8_ = vVar10._0_8_;
      local_7c._0_4_ = local_90.x;
      local_7c._4_4_ = local_90.y;
      uVar3 = local_7c;
      local_90.z = vVar10.z;
      local_74 = local_90.z;
      local_7c._0_4_ = vVar10.x;
      in_stack_fffffffffffffdc4 = (float)local_7c;
      local_90 = vVar10;
      local_7c = uVar3;
      pfVar9 = mat4f::operator[](in_RDI,0);
      *pfVar9 = in_stack_fffffffffffffdc4;
      fVar1 = local_7c._4_4_;
      pfVar9 = mat4f::operator[](in_RDI,1);
      fVar2 = local_74;
      pfVar9[1] = fVar1;
      pfVar9 = mat4f::operator[](in_RDI,2);
      pfVar9[2] = fVar2;
    }
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::find<char_const(&)[9]>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               (char (*) [9])CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    bVar5 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                         (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    if (bVar5) {
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      json2vec3f((Json *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
      anon_unknown.dwarf_c1e34::rotYXZ
                ((vec3f *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      operator*((mat4f *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                (mat4f *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      memcpy(in_RDI,local_110,0x40);
    }
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::find<char_const(&)[9]>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               (char (*) [9])CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    bVar5 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                         (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    if (bVar5) {
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      vVar10 = json2vec3f((Json *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
      local_1c8 = vVar10.z;
      local_1bc = vVar10.x;
      pfVar9 = mat4f::operator[](in_RDI,0);
      pfVar9[3] = local_1bc;
      fStack_1b8 = vVar10.y;
      pfVar9 = mat4f::operator[](in_RDI,1);
      pfVar9[3] = fStack_1b8;
      pfVar9 = mat4f::operator[](in_RDI,2);
      pfVar9[3] = local_1c8;
    }
  }
  return in_RDI;
}

Assistant:

mat4f parseTransform(const Json& conf) {
	if (conf.type() == Json::value_t::array) {
		std::vector<float> v = conf;
		if (v.size() != 16)
			throw "bad transformation matrix";
		return mat4f(v[0],v[1],v[2],v[3],v[4],v[5],v[6],v[7],v[8],v[9],v[10],v[11],v[12],v[13],v[14],v[15]);
	}
	mat4f trans = mat4f::unit;
	if (conf.find("scale") != conf.end()) {
		vec3f scale = json2vec3f(conf["scale"]);
		trans[0][0] = scale.x;
		trans[1][1] = scale.y;
		trans[2][2] = scale.z;
	}
	if (conf.find("rotation") != conf.end()) {
		// in degrees
		trans = rotYXZ(json2vec3f(conf["rotation"])) * trans;
	}
	if (conf.find("position") != conf.end()) {
		vec3f offset = json2vec3f(conf["position"]);
		trans[0][3] = offset.x;
		trans[1][3] = offset.y;
		trans[2][3] = offset.z;
	}
	return trans;
}